

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O0

int32_t uprv_stableBinarySearch_63
                  (char *array,int32_t limit,void *item,int32_t itemSize,UComparator *cmp,
                  void *context)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint local_50;
  int32_t diff_1;
  int32_t diff;
  int32_t i;
  UBool found;
  int32_t start;
  void *context_local;
  UComparator *cmp_local;
  int32_t itemSize_local;
  void *item_local;
  int32_t limit_local;
  char *array_local;
  
  i = 0;
  bVar1 = false;
  iVar4 = i;
  item_local._4_4_ = limit;
  while (i = iVar4, 8 < item_local._4_4_ - i) {
    iVar2 = (i + item_local._4_4_) / 2;
    iVar3 = (*cmp)(context,item,array + iVar2 * itemSize);
    if (iVar3 == 0) {
      bVar1 = true;
      iVar4 = iVar2 + 1;
    }
    else {
      iVar4 = iVar2;
      if (iVar3 < 0) {
        iVar4 = i;
        item_local._4_4_ = iVar2;
      }
    }
  }
  for (; i < item_local._4_4_; i = i + 1) {
    iVar4 = (*cmp)(context,item,array + i * itemSize);
    if (iVar4 == 0) {
      bVar1 = true;
    }
    else if (iVar4 < 0) break;
  }
  if (bVar1) {
    local_50 = i - 1;
  }
  else {
    local_50 = i ^ 0xffffffff;
  }
  return local_50;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_stableBinarySearch(char *array, int32_t limit, void *item, int32_t itemSize,
                        UComparator *cmp, const void *context) {
    int32_t start=0;
    UBool found=FALSE;

    /* Binary search until we get down to a tiny sub-array. */
    while((limit-start)>=MIN_QSORT) {
        int32_t i=(start+limit)/2;
        int32_t diff=cmp(context, item, array+i*itemSize);
        if(diff==0) {
            /*
             * Found the item. We look for the *last* occurrence of such
             * an item, for stable sorting.
             * If we knew that there will be only few equal items,
             * we could break now and enter the linear search.
             * However, if there are many equal items, then it should be
             * faster to continue with the binary search.
             * It seems likely that we either have all unique items
             * (where found will never become TRUE in the insertion sort)
             * or potentially many duplicates.
             */
            found=TRUE;
            start=i+1;
        } else if(diff<0) {
            limit=i;
        } else {
            start=i;
        }
    }

    /* Linear search over the remaining tiny sub-array. */
    while(start<limit) {
        int32_t diff=cmp(context, item, array+start*itemSize);
        if(diff==0) {
            found=TRUE;
        } else if(diff<0) {
            break;
        }
        ++start;
    }
    return found ? (start-1) : ~start;
}